

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  undefined8 __p;
  undefined1 local_e0 [200];
  
  local_e0._0_8_ = target;
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_0058d010;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  cmGeneratorTarget::GetExecutableNames
            ((Names *)(local_e0 + 8),
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  cmGeneratorTarget::Names::operator=
            (&(this->super_cmMakefileTargetGenerator).TargetNames,(Names *)(local_e0 + 8));
  cmGeneratorTarget::Names::~Names((Names *)(local_e0 + 8));
  std::make_unique<cmOSXBundleGenerator,cmGeneratorTarget*&,std::__cxx11::string&>
            ((cmGeneratorTarget **)(local_e0 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  __p = local_e0._8_8_;
  local_e0._8_8_ = 0;
  std::__uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::reset
            ((__uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *)
             &(this->super_cmMakefileTargetGenerator).OSXBundleGenerator,(pointer)__p);
  std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::~unique_ptr
            ((unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *)
             (local_e0 + 8));
  ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
   super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
   super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
   super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl)->MacContentFolders =
       &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->TargetNames =
    this->GeneratorTarget->GetExecutableNames(this->ConfigName);

  this->OSXBundleGenerator =
    cm::make_unique<cmOSXBundleGenerator>(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}